

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm.h
# Opt level: O0

void ncnn::convolution_im2col_pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  int kk_4;
  float *p0_4;
  __m128 _tmp1_4;
  __m128 _tmp0_4;
  __m128 _r1_5;
  __m128 _r0_5;
  __m256 _r1_4;
  __m256 _r0_4;
  int kk_3;
  float *p1_3;
  float *p0_3;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _r3_3;
  __m128 _r2_3;
  __m128 _r1_3;
  __m128 _r0_3;
  __m256 _r3_2;
  __m256 _r2_2;
  __m256 _r1_2;
  __m256 _r0_2;
  int kk_2;
  float *p3_2;
  float *p2_2;
  float *p1_2;
  float *p0_2;
  __m256 _r7_1;
  __m256 _r6_1;
  __m256 _r5_1;
  __m256 _r4_1;
  __m256 _r3_1;
  __m256 _r2_1;
  __m256 _r1_1;
  __m256 _r0_1;
  int kk_1;
  float *p7_1;
  float *p6_1;
  float *p5_1;
  float *p4_1;
  float *p3_1;
  float *p2_1;
  float *p1_1;
  float *p0_1;
  __m512 _rf;
  __m512 _re;
  __m512 _rd;
  __m512 _rc;
  __m512 _rb;
  __m512 _ra;
  __m512 _r9;
  __m512 _r8;
  __m512 _r7;
  __m512 _r6;
  __m512 _r5;
  __m512 _r4;
  __m512 _r3;
  __m512 _r2;
  __m512 _r1;
  __m512 _r0;
  int kk;
  float *pf;
  float *pe;
  float *pd;
  float *pc;
  float *pb;
  float *pa;
  float *p9;
  float *p8;
  float *p7;
  float *p6;
  float *p5;
  float *p4;
  float *p3;
  float *p2;
  float *p1;
  float *p0;
  int ii;
  float *pp;
  int A_hstep;
  __m256 _tmpf_1;
  __m256 _tmpe_1;
  __m256 _tmpd_1;
  __m256 _tmpc_1;
  __m256 _tmpb_1;
  __m256 _tmpa_1;
  __m256 _tmp9_1;
  __m256 _tmp8_1;
  __m256 _tmp7_1;
  __m256 _tmp6_1;
  __m256 _tmp5_1;
  __m256 _tmp4_1;
  __m256 _tmp3_1;
  __m256 _tmp2_1;
  __m256 _tmp1_1;
  __m256 _tmp0_1;
  __m256 _tmp7_2;
  __m256 _tmp6_2;
  __m256 _tmp5_2;
  __m256 _tmp4_2;
  __m256 _tmp3_2;
  __m256 _tmp2_2;
  __m256 _tmp1_2;
  __m256 _tmp0_2;
  __m256 _tmp1_3;
  __m256 _tmp0_3;
  __m512 _tmpv;
  __m512 _tmpu;
  __m512 _tmpt;
  __m512 _tmps;
  __m512 _tmpr;
  __m512 _tmpq;
  __m512 _tmpp;
  __m512 _tmpo;
  __m512 _tmpn;
  __m512 _tmpm;
  __m512 _tmpl;
  __m512 _tmpk;
  __m512 _tmpj;
  __m512 _tmpi;
  __m512 _tmph;
  __m512 _tmpg;
  __m512 _tmpf;
  __m512 _tmpe;
  __m512 _tmpd;
  __m512 _tmpc;
  __m512 _tmpb;
  __m512 _tmpa;
  __m512 _tmp9;
  __m512 _tmp8;
  __m512 _tmp7;
  __m512 _tmp6;
  __m512 _tmp5;
  __m512 _tmp4;
  __m512 _tmp3;
  __m512 _tmp2;
  __m512 _tmp1;
  __m512 _tmp0;
  int local_304c;
  undefined1 (*local_3048) [32];
  undefined8 local_3030;
  undefined8 uStack_3028;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  int local_2fb4;
  undefined1 (*local_2fb0) [32];
  undefined1 (*local_2fa8) [32];
  undefined8 local_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 local_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  int local_2e84;
  undefined1 (*local_2e80) [32];
  undefined1 (*local_2e78) [32];
  undefined1 (*local_2e70) [32];
  undefined1 (*local_2e68) [32];
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  int local_2d44;
  undefined1 (*local_2d40) [32];
  undefined1 (*local_2d38) [32];
  undefined1 (*local_2d30) [32];
  undefined1 (*local_2d28) [32];
  undefined1 (*local_2d20) [32];
  undefined1 (*local_2d18) [32];
  undefined1 (*local_2d10) [32];
  undefined1 (*local_2d08) [32];
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 uStack_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 uStack_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 uStack_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 uStack_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 uStack_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 uStack_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 uStack_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 uStack_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 uStack_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 uStack_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 uStack_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 uStack_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 uStack_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 uStack_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  int local_28fc;
  undefined1 (*local_28f8) [64];
  undefined1 (*local_28f0) [64];
  undefined1 (*local_28e8) [64];
  undefined1 (*local_28e0) [64];
  undefined1 (*local_28d8) [64];
  undefined1 (*local_28d0) [64];
  undefined1 (*local_28c8) [64];
  undefined1 (*local_28c0) [64];
  undefined1 (*local_28b8) [64];
  undefined1 (*local_28b0) [64];
  undefined1 (*local_28a8) [64];
  undefined1 (*local_28a0) [64];
  undefined1 (*local_2898) [64];
  undefined1 (*local_2890) [64];
  undefined1 (*local_2888) [64];
  undefined1 (*local_2880) [64];
  int local_2874;
  undefined1 (*local_2870) [32];
  
  iVar1 = *(int *)((long)in_RDI + 0x2c);
  local_2870 = (undefined1 (*) [32])*in_RSI;
  for (local_2874 = 0; local_2874 + 0xf < in_ECX; local_2874 = local_2874 + 0x10) {
    local_2880 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874) * iVar1) * 4 + (long)in_R8D * 4);
    local_2888 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 1) * iVar1) * 4 + (long)in_R8D * 4);
    local_2890 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 2) * iVar1) * 4 + (long)in_R8D * 4);
    local_2898 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 3) * iVar1) * 4 + (long)in_R8D * 4);
    local_28a0 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 4) * iVar1) * 4 + (long)in_R8D * 4);
    local_28a8 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 5) * iVar1) * 4 + (long)in_R8D * 4);
    local_28b0 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 6) * iVar1) * 4 + (long)in_R8D * 4);
    local_28b8 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 7) * iVar1) * 4 + (long)in_R8D * 4);
    local_28c0 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 8) * iVar1) * 4 + (long)in_R8D * 4);
    local_28c8 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 9) * iVar1) * 4 + (long)in_R8D * 4);
    local_28d0 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 10) * iVar1) * 4 + (long)in_R8D * 4);
    local_28d8 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 0xb) * iVar1) * 4 + (long)in_R8D * 4);
    local_28e0 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 0xc) * iVar1) * 4 + (long)in_R8D * 4);
    local_28e8 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 0xd) * iVar1) * 4 + (long)in_R8D * 4);
    local_28f0 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 0xe) * iVar1) * 4 + (long)in_R8D * 4);
    local_28f8 = (undefined1 (*) [64])
                 (*in_RDI + (long)((in_EDX + local_2874 + 0xf) * iVar1) * 4 + (long)in_R8D * 4);
    for (local_28fc = 0; local_28fc + 0xf < in_R9D; local_28fc = local_28fc + 0x10) {
      auVar17 = vunpcklps_avx512f(*local_2880,*local_2888);
      auVar18 = vunpckhps_avx512f(*local_2880,*local_2888);
      auVar19 = vunpcklps_avx512f(*local_2890,*local_2898);
      auVar20 = vunpckhps_avx512f(*local_2890,*local_2898);
      auVar21 = vunpcklps_avx512f(*local_28a0,*local_28a8);
      auVar22 = vunpckhps_avx512f(*local_28a0,*local_28a8);
      auVar23 = vunpcklps_avx512f(*local_28b0,*local_28b8);
      auVar24 = vunpckhps_avx512f(*local_28b0,*local_28b8);
      auVar25 = vunpcklps_avx512f(*local_28c0,*local_28c8);
      auVar26 = vunpckhps_avx512f(*local_28c0,*local_28c8);
      auVar27 = vunpcklps_avx512f(*local_28d0,*local_28d8);
      auVar28 = vunpckhps_avx512f(*local_28d0,*local_28d8);
      auVar29 = vunpcklps_avx512f(*local_28e0,*local_28e8);
      auVar30 = vunpckhps_avx512f(*local_28e0,*local_28e8);
      auVar31 = vunpcklps_avx512f(*local_28f0,*local_28f8);
      auVar32 = vunpckhps_avx512f(*local_28f0,*local_28f8);
      auVar33 = vunpcklpd_avx512f(auVar17,auVar19);
      auVar17 = vunpckhpd_avx512f(auVar17,auVar19);
      auVar19 = vunpcklpd_avx512f(auVar18,auVar20);
      auVar18 = vunpckhpd_avx512f(auVar18,auVar20);
      auVar20 = vunpcklpd_avx512f(auVar21,auVar23);
      auVar21 = vunpckhpd_avx512f(auVar21,auVar23);
      auVar23 = vunpcklpd_avx512f(auVar22,auVar24);
      auVar22 = vunpckhpd_avx512f(auVar22,auVar24);
      auVar24 = vunpcklpd_avx512f(auVar25,auVar27);
      auVar25 = vunpckhpd_avx512f(auVar25,auVar27);
      auVar27 = vunpcklpd_avx512f(auVar26,auVar28);
      auVar26 = vunpckhpd_avx512f(auVar26,auVar28);
      auVar28 = vunpcklpd_avx512f(auVar29,auVar31);
      auVar29 = vunpckhpd_avx512f(auVar29,auVar31);
      auVar31 = vunpcklpd_avx512f(auVar30,auVar32);
      auVar30 = vunpckhpd_avx512f(auVar30,auVar32);
      auVar32 = vshuff64x2_avx512f(auVar33,auVar20,0x88);
      auVar34 = vshuff64x2_avx512f(auVar24,auVar28,0x88);
      auVar35 = vshuff64x2_avx512f(auVar17,auVar21,0x88);
      auVar36 = vshuff64x2_avx512f(auVar25,auVar29,0x88);
      auVar37 = vshuff64x2_avx512f(auVar19,auVar23,0x88);
      auVar38 = vshuff64x2_avx512f(auVar27,auVar31,0x88);
      auVar39 = vshuff64x2_avx512f(auVar18,auVar22,0x88);
      auVar40 = vshuff64x2_avx512f(auVar26,auVar30,0x88);
      auVar20 = vshuff64x2_avx512f(auVar33,auVar20,0xdd);
      auVar24 = vshuff64x2_avx512f(auVar24,auVar28,0xdd);
      auVar17 = vshuff64x2_avx512f(auVar17,auVar21,0xdd);
      auVar21 = vshuff64x2_avx512f(auVar25,auVar29,0xdd);
      auVar19 = vshuff64x2_avx512f(auVar19,auVar23,0xdd);
      auVar23 = vshuff64x2_avx512f(auVar27,auVar31,0xdd);
      auVar18 = vshuff64x2_avx512f(auVar18,auVar22,0xdd);
      auVar22 = vshuff64x2_avx512f(auVar26,auVar30,0xdd);
      auVar25 = vshuff64x2_avx512f(auVar32,auVar34,0x88);
      auVar26 = vshuff64x2_avx512f(auVar35,auVar36,0x88);
      uStack_2948 = auVar26._56_8_;
      uStack_2950 = auVar26._48_8_;
      uStack_2958 = auVar26._40_8_;
      uStack_2960 = auVar26._32_8_;
      uStack_2968 = auVar26._24_8_;
      uStack_2970 = auVar26._16_8_;
      uStack_2978 = auVar26._8_8_;
      local_2980 = auVar26._0_8_;
      auVar26 = vshuff64x2_avx512f(auVar37,auVar38,0x88);
      uStack_2988 = auVar26._56_8_;
      uStack_2990 = auVar26._48_8_;
      uStack_2998 = auVar26._40_8_;
      uStack_29a0 = auVar26._32_8_;
      uStack_29a8 = auVar26._24_8_;
      uStack_29b0 = auVar26._16_8_;
      uStack_29b8 = auVar26._8_8_;
      local_29c0 = auVar26._0_8_;
      auVar26 = vshuff64x2_avx512f(auVar39,auVar40,0x88);
      uStack_29c8 = auVar26._56_8_;
      uStack_29d0 = auVar26._48_8_;
      uStack_29d8 = auVar26._40_8_;
      uStack_29e0 = auVar26._32_8_;
      uStack_29e8 = auVar26._24_8_;
      uStack_29f0 = auVar26._16_8_;
      uStack_29f8 = auVar26._8_8_;
      local_2a00 = auVar26._0_8_;
      auVar26 = vshuff64x2_avx512f(auVar20,auVar24,0x88);
      uStack_2a08 = auVar26._56_8_;
      uStack_2a10 = auVar26._48_8_;
      uStack_2a18 = auVar26._40_8_;
      uStack_2a20 = auVar26._32_8_;
      uStack_2a28 = auVar26._24_8_;
      uStack_2a30 = auVar26._16_8_;
      uStack_2a38 = auVar26._8_8_;
      local_2a40 = auVar26._0_8_;
      auVar26 = vshuff64x2_avx512f(auVar17,auVar21,0x88);
      uStack_2a48 = auVar26._56_8_;
      uStack_2a50 = auVar26._48_8_;
      uStack_2a58 = auVar26._40_8_;
      uStack_2a60 = auVar26._32_8_;
      uStack_2a68 = auVar26._24_8_;
      uStack_2a70 = auVar26._16_8_;
      uStack_2a78 = auVar26._8_8_;
      local_2a80 = auVar26._0_8_;
      auVar26 = vshuff64x2_avx512f(auVar19,auVar23,0x88);
      uStack_2a88 = auVar26._56_8_;
      uStack_2a90 = auVar26._48_8_;
      uStack_2a98 = auVar26._40_8_;
      uStack_2aa0 = auVar26._32_8_;
      uStack_2aa8 = auVar26._24_8_;
      uStack_2ab0 = auVar26._16_8_;
      uStack_2ab8 = auVar26._8_8_;
      local_2ac0 = auVar26._0_8_;
      auVar26 = vshuff64x2_avx512f(auVar18,auVar22,0x88);
      uStack_2ac8 = auVar26._56_8_;
      uStack_2ad0 = auVar26._48_8_;
      uStack_2ad8 = auVar26._40_8_;
      uStack_2ae0 = auVar26._32_8_;
      uStack_2ae8 = auVar26._24_8_;
      uStack_2af0 = auVar26._16_8_;
      uStack_2af8 = auVar26._8_8_;
      local_2b00 = auVar26._0_8_;
      auVar26 = vshuff64x2_avx512f(auVar32,auVar34,0xdd);
      uStack_2b08 = auVar26._56_8_;
      uStack_2b10 = auVar26._48_8_;
      uStack_2b18 = auVar26._40_8_;
      uStack_2b20 = auVar26._32_8_;
      uStack_2b28 = auVar26._24_8_;
      uStack_2b30 = auVar26._16_8_;
      uStack_2b38 = auVar26._8_8_;
      local_2b40 = auVar26._0_8_;
      auVar26 = vshuff64x2_avx512f(auVar35,auVar36,0xdd);
      uStack_2b48 = auVar26._56_8_;
      uStack_2b50 = auVar26._48_8_;
      uStack_2b58 = auVar26._40_8_;
      uStack_2b60 = auVar26._32_8_;
      uStack_2b68 = auVar26._24_8_;
      uStack_2b70 = auVar26._16_8_;
      uStack_2b78 = auVar26._8_8_;
      local_2b80 = auVar26._0_8_;
      auVar26 = vshuff64x2_avx512f(auVar37,auVar38,0xdd);
      uStack_2b88 = auVar26._56_8_;
      uStack_2b90 = auVar26._48_8_;
      uStack_2b98 = auVar26._40_8_;
      uStack_2ba0 = auVar26._32_8_;
      uStack_2ba8 = auVar26._24_8_;
      uStack_2bb0 = auVar26._16_8_;
      uStack_2bb8 = auVar26._8_8_;
      local_2bc0 = auVar26._0_8_;
      auVar26 = vshuff64x2_avx512f(auVar39,auVar40,0xdd);
      uStack_2bc8 = auVar26._56_8_;
      uStack_2bd0 = auVar26._48_8_;
      uStack_2bd8 = auVar26._40_8_;
      uStack_2be0 = auVar26._32_8_;
      uStack_2be8 = auVar26._24_8_;
      uStack_2bf0 = auVar26._16_8_;
      uStack_2bf8 = auVar26._8_8_;
      local_2c00 = auVar26._0_8_;
      auVar20 = vshuff64x2_avx512f(auVar20,auVar24,0xdd);
      uStack_2c08 = auVar20._56_8_;
      uStack_2c10 = auVar20._48_8_;
      uStack_2c18 = auVar20._40_8_;
      uStack_2c20 = auVar20._32_8_;
      uStack_2c28 = auVar20._24_8_;
      uStack_2c30 = auVar20._16_8_;
      uStack_2c38 = auVar20._8_8_;
      local_2c40 = auVar20._0_8_;
      auVar17 = vshuff64x2_avx512f(auVar17,auVar21,0xdd);
      uStack_2c48 = auVar17._56_8_;
      uStack_2c50 = auVar17._48_8_;
      uStack_2c58 = auVar17._40_8_;
      uStack_2c60 = auVar17._32_8_;
      uStack_2c68 = auVar17._24_8_;
      uStack_2c70 = auVar17._16_8_;
      uStack_2c78 = auVar17._8_8_;
      local_2c80 = auVar17._0_8_;
      auVar17 = vshuff64x2_avx512f(auVar19,auVar23,0xdd);
      uStack_2c88 = auVar17._56_8_;
      uStack_2c90 = auVar17._48_8_;
      uStack_2c98 = auVar17._40_8_;
      uStack_2ca0 = auVar17._32_8_;
      uStack_2ca8 = auVar17._24_8_;
      uStack_2cb0 = auVar17._16_8_;
      uStack_2cb8 = auVar17._8_8_;
      local_2cc0 = auVar17._0_8_;
      auVar17 = vshuff64x2_avx512f(auVar18,auVar22,0xdd);
      uStack_2908 = auVar25._56_8_;
      uStack_2910 = auVar25._48_8_;
      uStack_2918 = auVar25._40_8_;
      uStack_2920 = auVar25._32_8_;
      uStack_2928 = auVar25._24_8_;
      uStack_2930 = auVar25._16_8_;
      uStack_2938 = auVar25._8_8_;
      local_2940 = auVar25._0_8_;
      *(undefined8 *)*local_2870 = local_2940;
      *(undefined8 *)(*local_2870 + 8) = uStack_2938;
      *(undefined8 *)(*local_2870 + 0x10) = uStack_2930;
      *(undefined8 *)(*local_2870 + 0x18) = uStack_2928;
      *(undefined8 *)local_2870[1] = uStack_2920;
      *(undefined8 *)(local_2870[1] + 8) = uStack_2918;
      *(undefined8 *)(local_2870[1] + 0x10) = uStack_2910;
      *(undefined8 *)(local_2870[1] + 0x18) = uStack_2908;
      *(undefined8 *)local_2870[2] = local_2980;
      *(undefined8 *)(local_2870[2] + 8) = uStack_2978;
      *(undefined8 *)(local_2870[2] + 0x10) = uStack_2970;
      *(undefined8 *)(local_2870[2] + 0x18) = uStack_2968;
      *(undefined8 *)local_2870[3] = uStack_2960;
      *(undefined8 *)(local_2870[3] + 8) = uStack_2958;
      *(undefined8 *)(local_2870[3] + 0x10) = uStack_2950;
      *(undefined8 *)(local_2870[3] + 0x18) = uStack_2948;
      *(undefined8 *)local_2870[4] = local_29c0;
      *(undefined8 *)(local_2870[4] + 8) = uStack_29b8;
      *(undefined8 *)(local_2870[4] + 0x10) = uStack_29b0;
      *(undefined8 *)(local_2870[4] + 0x18) = uStack_29a8;
      *(undefined8 *)local_2870[5] = uStack_29a0;
      *(undefined8 *)(local_2870[5] + 8) = uStack_2998;
      *(undefined8 *)(local_2870[5] + 0x10) = uStack_2990;
      *(undefined8 *)(local_2870[5] + 0x18) = uStack_2988;
      *(undefined8 *)local_2870[6] = local_2a00;
      *(undefined8 *)(local_2870[6] + 8) = uStack_29f8;
      *(undefined8 *)(local_2870[6] + 0x10) = uStack_29f0;
      *(undefined8 *)(local_2870[6] + 0x18) = uStack_29e8;
      *(undefined8 *)local_2870[7] = uStack_29e0;
      *(undefined8 *)(local_2870[7] + 8) = uStack_29d8;
      *(undefined8 *)(local_2870[7] + 0x10) = uStack_29d0;
      *(undefined8 *)(local_2870[7] + 0x18) = uStack_29c8;
      *(undefined8 *)local_2870[8] = local_2a40;
      *(undefined8 *)(local_2870[8] + 8) = uStack_2a38;
      *(undefined8 *)(local_2870[8] + 0x10) = uStack_2a30;
      *(undefined8 *)(local_2870[8] + 0x18) = uStack_2a28;
      *(undefined8 *)local_2870[9] = uStack_2a20;
      *(undefined8 *)(local_2870[9] + 8) = uStack_2a18;
      *(undefined8 *)(local_2870[9] + 0x10) = uStack_2a10;
      *(undefined8 *)(local_2870[9] + 0x18) = uStack_2a08;
      *(undefined8 *)local_2870[10] = local_2a80;
      *(undefined8 *)(local_2870[10] + 8) = uStack_2a78;
      *(undefined8 *)(local_2870[10] + 0x10) = uStack_2a70;
      *(undefined8 *)(local_2870[10] + 0x18) = uStack_2a68;
      *(undefined8 *)local_2870[0xb] = uStack_2a60;
      *(undefined8 *)(local_2870[0xb] + 8) = uStack_2a58;
      *(undefined8 *)(local_2870[0xb] + 0x10) = uStack_2a50;
      *(undefined8 *)(local_2870[0xb] + 0x18) = uStack_2a48;
      *(undefined8 *)local_2870[0xc] = local_2ac0;
      *(undefined8 *)(local_2870[0xc] + 8) = uStack_2ab8;
      *(undefined8 *)(local_2870[0xc] + 0x10) = uStack_2ab0;
      *(undefined8 *)(local_2870[0xc] + 0x18) = uStack_2aa8;
      *(undefined8 *)local_2870[0xd] = uStack_2aa0;
      *(undefined8 *)(local_2870[0xd] + 8) = uStack_2a98;
      *(undefined8 *)(local_2870[0xd] + 0x10) = uStack_2a90;
      *(undefined8 *)(local_2870[0xd] + 0x18) = uStack_2a88;
      *(undefined8 *)local_2870[0xe] = local_2b00;
      *(undefined8 *)(local_2870[0xe] + 8) = uStack_2af8;
      *(undefined8 *)(local_2870[0xe] + 0x10) = uStack_2af0;
      *(undefined8 *)(local_2870[0xe] + 0x18) = uStack_2ae8;
      *(undefined8 *)local_2870[0xf] = uStack_2ae0;
      *(undefined8 *)(local_2870[0xf] + 8) = uStack_2ad8;
      *(undefined8 *)(local_2870[0xf] + 0x10) = uStack_2ad0;
      *(undefined8 *)(local_2870[0xf] + 0x18) = uStack_2ac8;
      *(undefined8 *)local_2870[0x10] = local_2b40;
      *(undefined8 *)(local_2870[0x10] + 8) = uStack_2b38;
      *(undefined8 *)(local_2870[0x10] + 0x10) = uStack_2b30;
      *(undefined8 *)(local_2870[0x10] + 0x18) = uStack_2b28;
      *(undefined8 *)local_2870[0x11] = uStack_2b20;
      *(undefined8 *)(local_2870[0x11] + 8) = uStack_2b18;
      *(undefined8 *)(local_2870[0x11] + 0x10) = uStack_2b10;
      *(undefined8 *)(local_2870[0x11] + 0x18) = uStack_2b08;
      *(undefined8 *)local_2870[0x12] = local_2b80;
      *(undefined8 *)(local_2870[0x12] + 8) = uStack_2b78;
      *(undefined8 *)(local_2870[0x12] + 0x10) = uStack_2b70;
      *(undefined8 *)(local_2870[0x12] + 0x18) = uStack_2b68;
      *(undefined8 *)local_2870[0x13] = uStack_2b60;
      *(undefined8 *)(local_2870[0x13] + 8) = uStack_2b58;
      *(undefined8 *)(local_2870[0x13] + 0x10) = uStack_2b50;
      *(undefined8 *)(local_2870[0x13] + 0x18) = uStack_2b48;
      *(undefined8 *)local_2870[0x14] = local_2bc0;
      *(undefined8 *)(local_2870[0x14] + 8) = uStack_2bb8;
      *(undefined8 *)(local_2870[0x14] + 0x10) = uStack_2bb0;
      *(undefined8 *)(local_2870[0x14] + 0x18) = uStack_2ba8;
      *(undefined8 *)local_2870[0x15] = uStack_2ba0;
      *(undefined8 *)(local_2870[0x15] + 8) = uStack_2b98;
      *(undefined8 *)(local_2870[0x15] + 0x10) = uStack_2b90;
      *(undefined8 *)(local_2870[0x15] + 0x18) = uStack_2b88;
      *(undefined8 *)local_2870[0x16] = local_2c00;
      *(undefined8 *)(local_2870[0x16] + 8) = uStack_2bf8;
      *(undefined8 *)(local_2870[0x16] + 0x10) = uStack_2bf0;
      *(undefined8 *)(local_2870[0x16] + 0x18) = uStack_2be8;
      *(undefined8 *)local_2870[0x17] = uStack_2be0;
      *(undefined8 *)(local_2870[0x17] + 8) = uStack_2bd8;
      *(undefined8 *)(local_2870[0x17] + 0x10) = uStack_2bd0;
      *(undefined8 *)(local_2870[0x17] + 0x18) = uStack_2bc8;
      *(undefined8 *)local_2870[0x18] = local_2c40;
      *(undefined8 *)(local_2870[0x18] + 8) = uStack_2c38;
      *(undefined8 *)(local_2870[0x18] + 0x10) = uStack_2c30;
      *(undefined8 *)(local_2870[0x18] + 0x18) = uStack_2c28;
      *(undefined8 *)local_2870[0x19] = uStack_2c20;
      *(undefined8 *)(local_2870[0x19] + 8) = uStack_2c18;
      *(undefined8 *)(local_2870[0x19] + 0x10) = uStack_2c10;
      *(undefined8 *)(local_2870[0x19] + 0x18) = uStack_2c08;
      *(undefined8 *)local_2870[0x1a] = local_2c80;
      *(undefined8 *)(local_2870[0x1a] + 8) = uStack_2c78;
      *(undefined8 *)(local_2870[0x1a] + 0x10) = uStack_2c70;
      *(undefined8 *)(local_2870[0x1a] + 0x18) = uStack_2c68;
      *(undefined8 *)local_2870[0x1b] = uStack_2c60;
      *(undefined8 *)(local_2870[0x1b] + 8) = uStack_2c58;
      *(undefined8 *)(local_2870[0x1b] + 0x10) = uStack_2c50;
      *(undefined8 *)(local_2870[0x1b] + 0x18) = uStack_2c48;
      *(undefined8 *)local_2870[0x1c] = local_2cc0;
      *(undefined8 *)(local_2870[0x1c] + 8) = uStack_2cb8;
      *(undefined8 *)(local_2870[0x1c] + 0x10) = uStack_2cb0;
      *(undefined8 *)(local_2870[0x1c] + 0x18) = uStack_2ca8;
      *(undefined8 *)local_2870[0x1d] = uStack_2ca0;
      *(undefined8 *)(local_2870[0x1d] + 8) = uStack_2c98;
      *(undefined8 *)(local_2870[0x1d] + 0x10) = uStack_2c90;
      *(undefined8 *)(local_2870[0x1d] + 0x18) = uStack_2c88;
      *(undefined1 (*) [64])(local_2870 + 0x1e) = auVar17;
      local_2870 = local_2870 + 0x20;
      local_2880 = local_2880 + 1;
      local_2888 = local_2888 + 1;
      local_2890 = local_2890 + 1;
      local_2898 = local_2898 + 1;
      local_28a0 = local_28a0 + 1;
      local_28a8 = local_28a8 + 1;
      local_28b0 = local_28b0 + 1;
      local_28b8 = local_28b8 + 1;
      local_28c0 = local_28c0 + 1;
      local_28c8 = local_28c8 + 1;
      local_28d0 = local_28d0 + 1;
      local_28d8 = local_28d8 + 1;
      local_28e0 = local_28e0 + 1;
      local_28e8 = local_28e8 + 1;
      local_28f0 = local_28f0 + 1;
      local_28f8 = local_28f8 + 1;
    }
    for (; local_28fc < in_R9D; local_28fc = local_28fc + 1) {
      *(undefined4 *)*local_2870 = *(undefined4 *)*local_2880;
      *(undefined4 *)(*local_2870 + 4) = *(undefined4 *)*local_2888;
      *(undefined4 *)(*local_2870 + 8) = *(undefined4 *)*local_2890;
      *(undefined4 *)(*local_2870 + 0xc) = *(undefined4 *)*local_2898;
      *(undefined4 *)(*local_2870 + 0x10) = *(undefined4 *)*local_28a0;
      *(undefined4 *)(*local_2870 + 0x14) = *(undefined4 *)*local_28a8;
      *(undefined4 *)(*local_2870 + 0x18) = *(undefined4 *)*local_28b0;
      *(undefined4 *)(*local_2870 + 0x1c) = *(undefined4 *)*local_28b8;
      *(undefined4 *)local_2870[1] = *(undefined4 *)*local_28c0;
      *(undefined4 *)(local_2870[1] + 4) = *(undefined4 *)*local_28c8;
      *(undefined4 *)(local_2870[1] + 8) = *(undefined4 *)*local_28d0;
      *(undefined4 *)(local_2870[1] + 0xc) = *(undefined4 *)*local_28d8;
      *(undefined4 *)(local_2870[1] + 0x10) = *(undefined4 *)*local_28e0;
      *(undefined4 *)(local_2870[1] + 0x14) = *(undefined4 *)*local_28e8;
      *(undefined4 *)(local_2870[1] + 0x18) = *(undefined4 *)*local_28f0;
      *(undefined4 *)(local_2870[1] + 0x1c) = *(undefined4 *)*local_28f8;
      local_2870 = local_2870 + 2;
      local_2880 = (undefined1 (*) [64])(*local_2880 + 4);
      local_2888 = (undefined1 (*) [64])(*local_2888 + 4);
      local_2890 = (undefined1 (*) [64])(*local_2890 + 4);
      local_2898 = (undefined1 (*) [64])(*local_2898 + 4);
      local_28a0 = (undefined1 (*) [64])(*local_28a0 + 4);
      local_28a8 = (undefined1 (*) [64])(*local_28a8 + 4);
      local_28b0 = (undefined1 (*) [64])(*local_28b0 + 4);
      local_28b8 = (undefined1 (*) [64])(*local_28b8 + 4);
      local_28c0 = (undefined1 (*) [64])(*local_28c0 + 4);
      local_28c8 = (undefined1 (*) [64])(*local_28c8 + 4);
      local_28d0 = (undefined1 (*) [64])(*local_28d0 + 4);
      local_28d8 = (undefined1 (*) [64])(*local_28d8 + 4);
      local_28e0 = (undefined1 (*) [64])(*local_28e0 + 4);
      local_28e8 = (undefined1 (*) [64])(*local_28e8 + 4);
      local_28f0 = (undefined1 (*) [64])(*local_28f0 + 4);
      local_28f8 = (undefined1 (*) [64])(*local_28f8 + 4);
    }
  }
  for (; local_2874 + 7 < in_ECX; local_2874 = local_2874 + 8) {
    local_2d08 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874) * iVar1) * 4 + (long)in_R8D * 4);
    local_2d10 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874 + 1) * iVar1) * 4 + (long)in_R8D * 4);
    local_2d18 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874 + 2) * iVar1) * 4 + (long)in_R8D * 4);
    local_2d20 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874 + 3) * iVar1) * 4 + (long)in_R8D * 4);
    local_2d28 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874 + 4) * iVar1) * 4 + (long)in_R8D * 4);
    local_2d30 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874 + 5) * iVar1) * 4 + (long)in_R8D * 4);
    local_2d38 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874 + 6) * iVar1) * 4 + (long)in_R8D * 4);
    local_2d40 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874 + 7) * iVar1) * 4 + (long)in_R8D * 4);
    for (local_2d44 = 0; local_2d44 + 7 < in_R9D; local_2d44 = local_2d44 + 8) {
      auVar13 = vunpcklps_avx(*local_2d08,*local_2d10);
      auVar4 = vunpckhps_avx(*local_2d08,*local_2d10);
      auVar14 = vunpcklps_avx(*local_2d18,*local_2d20);
      auVar5 = vunpckhps_avx(*local_2d18,*local_2d20);
      auVar15 = vunpcklps_avx(*local_2d28,*local_2d30);
      auVar6 = vunpckhps_avx(*local_2d28,*local_2d30);
      auVar16 = vunpcklps_avx(*local_2d38,*local_2d40);
      auVar7 = vunpckhps_avx(*local_2d38,*local_2d40);
      auVar9 = vunpcklpd_avx(auVar13,auVar14);
      auVar13 = vunpckhpd_avx(auVar13,auVar14);
      auVar14 = vunpcklpd_avx(auVar4,auVar5);
      auVar4 = vunpckhpd_avx(auVar4,auVar5);
      auVar10 = vunpcklpd_avx(auVar15,auVar16);
      auVar5 = vunpckhpd_avx(auVar15,auVar16);
      auVar15 = vunpcklpd_avx(auVar6,auVar7);
      auVar6 = vunpckhpd_avx(auVar6,auVar7);
      auVar7 = vperm2f128_avx(auVar9,auVar10,0x20);
      auVar16 = vperm2f128_avx(auVar13,auVar5,0x20);
      uStack_2d88 = auVar16._24_8_;
      uStack_2d90 = auVar16._16_8_;
      uStack_2d98 = auVar16._8_8_;
      local_2da0 = auVar16._0_8_;
      auVar16 = vperm2f128_avx(auVar14,auVar15,0x20);
      uStack_2da8 = auVar16._24_8_;
      uStack_2db0 = auVar16._16_8_;
      uStack_2db8 = auVar16._8_8_;
      local_2dc0 = auVar16._0_8_;
      auVar16 = vperm2f128_avx(auVar4,auVar6,0x20);
      uStack_2dc8 = auVar16._24_8_;
      uStack_2dd0 = auVar16._16_8_;
      uStack_2dd8 = auVar16._8_8_;
      local_2de0 = auVar16._0_8_;
      auVar9 = vperm2f128_avx(auVar9,auVar10,0x31);
      uStack_2de8 = auVar9._24_8_;
      uStack_2df0 = auVar9._16_8_;
      uStack_2df8 = auVar9._8_8_;
      local_2e00 = auVar9._0_8_;
      auVar13 = vperm2f128_avx(auVar13,auVar5,0x31);
      uStack_2e08 = auVar13._24_8_;
      uStack_2e10 = auVar13._16_8_;
      uStack_2e18 = auVar13._8_8_;
      local_2e20 = auVar13._0_8_;
      auVar13 = vperm2f128_avx(auVar14,auVar15,0x31);
      uStack_2e28 = auVar13._24_8_;
      uStack_2e30 = auVar13._16_8_;
      uStack_2e38 = auVar13._8_8_;
      local_2e40 = auVar13._0_8_;
      auVar13 = vperm2f128_avx(auVar4,auVar6,0x31);
      uStack_2d68 = auVar7._24_8_;
      uStack_2d70 = auVar7._16_8_;
      uStack_2d78 = auVar7._8_8_;
      local_2d80 = auVar7._0_8_;
      *(undefined8 *)*local_2870 = local_2d80;
      *(undefined8 *)(*local_2870 + 8) = uStack_2d78;
      *(undefined8 *)(*local_2870 + 0x10) = uStack_2d70;
      *(undefined8 *)(*local_2870 + 0x18) = uStack_2d68;
      *(undefined8 *)local_2870[1] = local_2da0;
      *(undefined8 *)(local_2870[1] + 8) = uStack_2d98;
      *(undefined8 *)(local_2870[1] + 0x10) = uStack_2d90;
      *(undefined8 *)(local_2870[1] + 0x18) = uStack_2d88;
      *(undefined8 *)local_2870[2] = local_2dc0;
      *(undefined8 *)(local_2870[2] + 8) = uStack_2db8;
      *(undefined8 *)(local_2870[2] + 0x10) = uStack_2db0;
      *(undefined8 *)(local_2870[2] + 0x18) = uStack_2da8;
      *(undefined8 *)local_2870[3] = local_2de0;
      *(undefined8 *)(local_2870[3] + 8) = uStack_2dd8;
      *(undefined8 *)(local_2870[3] + 0x10) = uStack_2dd0;
      *(undefined8 *)(local_2870[3] + 0x18) = uStack_2dc8;
      *(undefined8 *)local_2870[4] = local_2e00;
      *(undefined8 *)(local_2870[4] + 8) = uStack_2df8;
      *(undefined8 *)(local_2870[4] + 0x10) = uStack_2df0;
      *(undefined8 *)(local_2870[4] + 0x18) = uStack_2de8;
      *(undefined8 *)local_2870[5] = local_2e20;
      *(undefined8 *)(local_2870[5] + 8) = uStack_2e18;
      *(undefined8 *)(local_2870[5] + 0x10) = uStack_2e10;
      *(undefined8 *)(local_2870[5] + 0x18) = uStack_2e08;
      *(undefined8 *)local_2870[6] = local_2e40;
      *(undefined8 *)(local_2870[6] + 8) = uStack_2e38;
      *(undefined8 *)(local_2870[6] + 0x10) = uStack_2e30;
      *(undefined8 *)(local_2870[6] + 0x18) = uStack_2e28;
      local_2870[7] = auVar13;
      local_2870 = local_2870 + 8;
      local_2d08 = local_2d08 + 1;
      local_2d10 = local_2d10 + 1;
      local_2d18 = local_2d18 + 1;
      local_2d20 = local_2d20 + 1;
      local_2d28 = local_2d28 + 1;
      local_2d30 = local_2d30 + 1;
      local_2d38 = local_2d38 + 1;
      local_2d40 = local_2d40 + 1;
    }
    for (; local_2d44 < in_R9D; local_2d44 = local_2d44 + 1) {
      *(undefined4 *)*local_2870 = *(undefined4 *)*local_2d08;
      *(undefined4 *)(*local_2870 + 4) = *(undefined4 *)*local_2d10;
      *(undefined4 *)(*local_2870 + 8) = *(undefined4 *)*local_2d18;
      *(undefined4 *)(*local_2870 + 0xc) = *(undefined4 *)*local_2d20;
      *(undefined4 *)(*local_2870 + 0x10) = *(undefined4 *)*local_2d28;
      *(undefined4 *)(*local_2870 + 0x14) = *(undefined4 *)*local_2d30;
      *(undefined4 *)(*local_2870 + 0x18) = *(undefined4 *)*local_2d38;
      *(undefined4 *)(*local_2870 + 0x1c) = *(undefined4 *)*local_2d40;
      local_2870 = local_2870 + 1;
      local_2d08 = (undefined1 (*) [32])(*local_2d08 + 4);
      local_2d10 = (undefined1 (*) [32])(*local_2d10 + 4);
      local_2d18 = (undefined1 (*) [32])(*local_2d18 + 4);
      local_2d20 = (undefined1 (*) [32])(*local_2d20 + 4);
      local_2d28 = (undefined1 (*) [32])(*local_2d28 + 4);
      local_2d30 = (undefined1 (*) [32])(*local_2d30 + 4);
      local_2d38 = (undefined1 (*) [32])(*local_2d38 + 4);
      local_2d40 = (undefined1 (*) [32])(*local_2d40 + 4);
    }
  }
  for (; local_2874 + 3 < in_ECX; local_2874 = local_2874 + 4) {
    local_2e68 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874) * iVar1) * 4 + (long)in_R8D * 4);
    local_2e70 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874 + 1) * iVar1) * 4 + (long)in_R8D * 4);
    local_2e78 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874 + 2) * iVar1) * 4 + (long)in_R8D * 4);
    local_2e80 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874 + 3) * iVar1) * 4 + (long)in_R8D * 4);
    for (local_2e84 = 0; local_2e84 + 7 < in_R9D; local_2e84 = local_2e84 + 8) {
      auVar13 = vunpcklps_avx(*local_2e68,*local_2e70);
      auVar4 = vunpckhps_avx(*local_2e68,*local_2e70);
      auVar7 = vunpcklps_avx(*local_2e78,*local_2e80);
      auVar5 = vunpckhps_avx(*local_2e78,*local_2e80);
      auVar6 = vunpcklpd_avx(auVar13,auVar7);
      auVar13 = vunpckhpd_avx(auVar13,auVar7);
      auVar7 = vunpcklpd_avx(auVar4,auVar5);
      auVar4 = vunpckhpd_avx(auVar4,auVar5);
      auVar5 = vperm2f128_avx(auVar6,auVar13,0x20);
      auVar9 = vperm2f128_avx(auVar7,auVar4,0x20);
      uStack_2ec8 = auVar9._24_8_;
      uStack_2ed0 = auVar9._16_8_;
      uStack_2ed8 = auVar9._8_8_;
      local_2ee0 = auVar9._0_8_;
      auVar13 = vperm2f128_avx(auVar6,auVar13,0x31);
      uStack_2ee8 = auVar13._24_8_;
      uStack_2ef0 = auVar13._16_8_;
      uStack_2ef8 = auVar13._8_8_;
      local_2f00 = auVar13._0_8_;
      auVar13 = vperm2f128_avx(auVar7,auVar4,0x31);
      uStack_2ea8 = auVar5._24_8_;
      uStack_2eb0 = auVar5._16_8_;
      uStack_2eb8 = auVar5._8_8_;
      local_2ec0 = auVar5._0_8_;
      *(undefined8 *)*local_2870 = local_2ec0;
      *(undefined8 *)(*local_2870 + 8) = uStack_2eb8;
      *(undefined8 *)(*local_2870 + 0x10) = uStack_2eb0;
      *(undefined8 *)(*local_2870 + 0x18) = uStack_2ea8;
      *(undefined8 *)local_2870[1] = local_2ee0;
      *(undefined8 *)(local_2870[1] + 8) = uStack_2ed8;
      *(undefined8 *)(local_2870[1] + 0x10) = uStack_2ed0;
      *(undefined8 *)(local_2870[1] + 0x18) = uStack_2ec8;
      *(undefined8 *)local_2870[2] = local_2f00;
      *(undefined8 *)(local_2870[2] + 8) = uStack_2ef8;
      *(undefined8 *)(local_2870[2] + 0x10) = uStack_2ef0;
      *(undefined8 *)(local_2870[2] + 0x18) = uStack_2ee8;
      local_2870[3] = auVar13;
      local_2870 = local_2870 + 4;
      local_2e68 = local_2e68 + 1;
      local_2e70 = local_2e70 + 1;
      local_2e78 = local_2e78 + 1;
      local_2e80 = local_2e80 + 1;
    }
    for (; local_2e84 + 3 < in_R9D; local_2e84 = local_2e84 + 4) {
      auVar11 = vunpcklps_avx(*(undefined1 (*) [16])*local_2e68,*(undefined1 (*) [16])*local_2e70);
      auVar12 = vunpcklps_avx(*(undefined1 (*) [16])*local_2e78,*(undefined1 (*) [16])*local_2e80);
      auVar2 = vunpckhps_avx(*(undefined1 (*) [16])*local_2e68,*(undefined1 (*) [16])*local_2e70);
      auVar3 = vunpckhps_avx(*(undefined1 (*) [16])*local_2e78,*(undefined1 (*) [16])*local_2e80);
      auVar8 = vunpcklpd_avx(auVar11,auVar12);
      auVar11 = vunpckhpd_avx(auVar11,auVar12);
      auVar12 = vunpcklpd_avx(auVar2,auVar3);
      auVar2 = vunpckhpd_avx(auVar2,auVar3);
      local_2f30 = auVar8._0_8_;
      uStack_2f28 = auVar8._8_8_;
      *(undefined8 *)*local_2870 = local_2f30;
      *(undefined8 *)(*local_2870 + 8) = uStack_2f28;
      local_2f40 = auVar11._0_8_;
      uStack_2f38 = auVar11._8_8_;
      *(undefined8 *)(*local_2870 + 0x10) = local_2f40;
      *(undefined8 *)(*local_2870 + 0x18) = uStack_2f38;
      local_2f50 = auVar12._0_8_;
      uStack_2f48 = auVar12._8_8_;
      *(undefined8 *)local_2870[1] = local_2f50;
      *(undefined8 *)(local_2870[1] + 8) = uStack_2f48;
      *(undefined1 (*) [16])(local_2870[1] + 0x10) = auVar2;
      local_2870 = local_2870 + 2;
      local_2e68 = (undefined1 (*) [32])(*local_2e68 + 0x10);
      local_2e70 = (undefined1 (*) [32])(*local_2e70 + 0x10);
      local_2e78 = (undefined1 (*) [32])(*local_2e78 + 0x10);
      local_2e80 = (undefined1 (*) [32])(*local_2e80 + 0x10);
    }
    for (; local_2e84 < in_R9D; local_2e84 = local_2e84 + 1) {
      *(undefined4 *)*local_2870 = *(undefined4 *)*local_2e68;
      *(undefined4 *)(*local_2870 + 4) = *(undefined4 *)*local_2e70;
      *(undefined4 *)(*local_2870 + 8) = *(undefined4 *)*local_2e78;
      *(undefined4 *)(*local_2870 + 0xc) = *(undefined4 *)*local_2e80;
      local_2870 = (undefined1 (*) [32])(*local_2870 + 0x10);
      local_2e68 = (undefined1 (*) [32])(*local_2e68 + 4);
      local_2e70 = (undefined1 (*) [32])(*local_2e70 + 4);
      local_2e78 = (undefined1 (*) [32])(*local_2e78 + 4);
      local_2e80 = (undefined1 (*) [32])(*local_2e80 + 4);
    }
  }
  for (; local_2874 + 1 < in_ECX; local_2874 = local_2874 + 2) {
    local_2fa8 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874) * iVar1) * 4 + (long)in_R8D * 4);
    local_2fb0 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874 + 1) * iVar1) * 4 + (long)in_R8D * 4);
    for (local_2fb4 = 0; local_2fb4 + 7 < in_R9D; local_2fb4 = local_2fb4 + 8) {
      auVar4 = vunpcklps_avx(*local_2fa8,*local_2fb0);
      auVar13 = vunpckhps_avx(*local_2fa8,*local_2fb0);
      auVar5 = vperm2f128_avx(auVar4,auVar13,0x20);
      auVar13 = vperm2f128_avx(auVar4,auVar13,0x31);
      uStack_2fc8 = auVar5._24_8_;
      uStack_2fd0 = auVar5._16_8_;
      uStack_2fd8 = auVar5._8_8_;
      local_2fe0 = auVar5._0_8_;
      *(undefined8 *)*local_2870 = local_2fe0;
      *(undefined8 *)(*local_2870 + 8) = uStack_2fd8;
      *(undefined8 *)(*local_2870 + 0x10) = uStack_2fd0;
      *(undefined8 *)(*local_2870 + 0x18) = uStack_2fc8;
      local_2870[1] = auVar13;
      local_2870 = local_2870 + 2;
      local_2fa8 = local_2fa8 + 1;
      local_2fb0 = local_2fb0 + 1;
    }
    for (; local_2fb4 + 3 < in_R9D; local_2fb4 = local_2fb4 + 4) {
      auVar2 = vunpcklps_avx(*(undefined1 (*) [16])*local_2fa8,*(undefined1 (*) [16])*local_2fb0);
      auVar11 = vunpckhps_avx(*(undefined1 (*) [16])*local_2fa8,*(undefined1 (*) [16])*local_2fb0);
      local_3030 = auVar2._0_8_;
      uStack_3028 = auVar2._8_8_;
      *(undefined8 *)*local_2870 = local_3030;
      *(undefined8 *)(*local_2870 + 8) = uStack_3028;
      *(undefined1 (*) [16])(*local_2870 + 0x10) = auVar11;
      local_2870 = local_2870 + 1;
      local_2fa8 = (undefined1 (*) [32])(*local_2fa8 + 0x10);
      local_2fb0 = (undefined1 (*) [32])(*local_2fb0 + 0x10);
    }
    for (; local_2fb4 < in_R9D; local_2fb4 = local_2fb4 + 1) {
      *(undefined4 *)*local_2870 = *(undefined4 *)*local_2fa8;
      *(undefined4 *)(*local_2870 + 4) = *(undefined4 *)*local_2fb0;
      local_2870 = (undefined1 (*) [32])(*local_2870 + 8);
      local_2fa8 = (undefined1 (*) [32])(*local_2fa8 + 4);
      local_2fb0 = (undefined1 (*) [32])(*local_2fb0 + 4);
    }
  }
  for (; local_2874 < in_ECX; local_2874 = local_2874 + 1) {
    local_3048 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2874) * iVar1) * 4 + (long)in_R8D * 4);
    for (local_304c = 0; local_304c + 7 < in_R9D; local_304c = local_304c + 8) {
      *local_2870 = *local_3048;
      local_2870 = local_2870 + 1;
      local_3048 = local_3048 + 1;
    }
    for (; local_304c + 3 < in_R9D; local_304c = local_304c + 4) {
      *(undefined1 (*) [16])*local_2870 = *(undefined1 (*) [16])*local_3048;
      local_2870 = (undefined1 (*) [32])(*local_2870 + 0x10);
      local_3048 = (undefined1 (*) [32])(*local_3048 + 0x10);
    }
    for (; local_304c < in_R9D; local_304c = local_304c + 1) {
      *(undefined4 *)*local_2870 = *(undefined4 *)*local_3048;
      local_2870 = (undefined1 (*) [32])(*local_2870 + 4);
      local_3048 = (undefined1 (*) [32])(*local_3048 + 4);
    }
  }
  return;
}

Assistant:

static void convolution_im2col_pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    // A = (pa, maxk, inch/pa), outch
    const int A_hstep = A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
        const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
        const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
        const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
        const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
        const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
        const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
        const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;
        const float* p8 = (const float*)A + (i + ii + 8) * A_hstep + k;
        const float* p9 = (const float*)A + (i + ii + 9) * A_hstep + k;
        const float* pa = (const float*)A + (i + ii + 10) * A_hstep + k;
        const float* pb = (const float*)A + (i + ii + 11) * A_hstep + k;
        const float* pc = (const float*)A + (i + ii + 12) * A_hstep + k;
        const float* pd = (const float*)A + (i + ii + 13) * A_hstep + k;
        const float* pe = (const float*)A + (i + ii + 14) * A_hstep + k;
        const float* pf = (const float*)A + (i + ii + 15) * A_hstep + k;

        int kk = 0;
        for (; kk + 15 < max_kk; kk += 16)
        {
            __m512 _r0 = _mm512_loadu_ps(p0);
            __m512 _r1 = _mm512_loadu_ps(p1);
            __m512 _r2 = _mm512_loadu_ps(p2);
            __m512 _r3 = _mm512_loadu_ps(p3);
            __m512 _r4 = _mm512_loadu_ps(p4);
            __m512 _r5 = _mm512_loadu_ps(p5);
            __m512 _r6 = _mm512_loadu_ps(p6);
            __m512 _r7 = _mm512_loadu_ps(p7);
            __m512 _r8 = _mm512_loadu_ps(p8);
            __m512 _r9 = _mm512_loadu_ps(p9);
            __m512 _ra = _mm512_loadu_ps(pa);
            __m512 _rb = _mm512_loadu_ps(pb);
            __m512 _rc = _mm512_loadu_ps(pc);
            __m512 _rd = _mm512_loadu_ps(pd);
            __m512 _re = _mm512_loadu_ps(pe);
            __m512 _rf = _mm512_loadu_ps(pf);
            transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
            _mm512_store_ps(pp, _r0);
            _mm512_store_ps(pp + 16, _r1);
            _mm512_store_ps(pp + 16 * 2, _r2);
            _mm512_store_ps(pp + 16 * 3, _r3);
            _mm512_store_ps(pp + 16 * 4, _r4);
            _mm512_store_ps(pp + 16 * 5, _r5);
            _mm512_store_ps(pp + 16 * 6, _r6);
            _mm512_store_ps(pp + 16 * 7, _r7);
            _mm512_store_ps(pp + 16 * 8, _r8);
            _mm512_store_ps(pp + 16 * 9, _r9);
            _mm512_store_ps(pp + 16 * 10, _ra);
            _mm512_store_ps(pp + 16 * 11, _rb);
            _mm512_store_ps(pp + 16 * 12, _rc);
            _mm512_store_ps(pp + 16 * 13, _rd);
            _mm512_store_ps(pp + 16 * 14, _re);
            _mm512_store_ps(pp + 16 * 15, _rf);
            pp += 256;
            p0 += 16;
            p1 += 16;
            p2 += 16;
            p3 += 16;
            p4 += 16;
            p5 += 16;
            p6 += 16;
            p7 += 16;
            p8 += 16;
            p9 += 16;
            pa += 16;
            pb += 16;
            pc += 16;
            pd += 16;
            pe += 16;
            pf += 16;
        }
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp[1] = p1[0];
            pp[2] = p2[0];
            pp[3] = p3[0];
            pp[4] = p4[0];
            pp[5] = p5[0];
            pp[6] = p6[0];
            pp[7] = p7[0];
            pp[8] = p8[0];
            pp[9] = p9[0];
            pp[10] = pa[0];
            pp[11] = pb[0];
            pp[12] = pc[0];
            pp[13] = pd[0];
            pp[14] = pe[0];
            pp[15] = pf[0];
            pp += 16;
            p0++;
            p1++;
            p2++;
            p3++;
            p4++;
            p5++;
            p6++;
            p7++;
            p8++;
            p9++;
            pa++;
            pb++;
            pc++;
            pd++;
            pe++;
            pf++;
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
        const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
        const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
        const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
        const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
        const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
        const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
        const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
        const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;

        int kk = 0;
        for (; kk + 7 < max_kk; kk += 8)
        {
            __m256 _r0 = _mm256_loadu_ps(p0);
            __m256 _r1 = _mm256_loadu_ps(p1);
            __m256 _r2 = _mm256_loadu_ps(p2);
            __m256 _r3 = _mm256_loadu_ps(p3);
            __m256 _r4 = _mm256_loadu_ps(p4);
            __m256 _r5 = _mm256_loadu_ps(p5);
            __m256 _r6 = _mm256_loadu_ps(p6);
            __m256 _r7 = _mm256_loadu_ps(p7);
            transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
            _mm256_store_ps(pp, _r0);
            _mm256_store_ps(pp + 8, _r1);
            _mm256_store_ps(pp + 8 * 2, _r2);
            _mm256_store_ps(pp + 8 * 3, _r3);
            _mm256_store_ps(pp + 8 * 4, _r4);
            _mm256_store_ps(pp + 8 * 5, _r5);
            _mm256_store_ps(pp + 8 * 6, _r6);
            _mm256_store_ps(pp + 8 * 7, _r7);
            pp += 64;
            p0 += 8;
            p1 += 8;
            p2 += 8;
            p3 += 8;
            p4 += 8;
            p5 += 8;
            p6 += 8;
            p7 += 8;
        }
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp[1] = p1[0];
            pp[2] = p2[0];
            pp[3] = p3[0];
            pp[4] = p4[0];
            pp[5] = p5[0];
            pp[6] = p6[0];
            pp[7] = p7[0];
            pp += 8;
            p0++;
            p1++;
            p2++;
            p3++;
            p4++;
            p5++;
            p6++;
            p7++;
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
        const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
        const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
        const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
        const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;

        int kk = 0;
#if __AVX__
        for (; kk + 7 < max_kk; kk += 8)
        {
            __m256 _r0 = _mm256_loadu_ps(p0);
            __m256 _r1 = _mm256_loadu_ps(p1);
            __m256 _r2 = _mm256_loadu_ps(p2);
            __m256 _r3 = _mm256_loadu_ps(p3);
            transpose8x4_ps(_r0, _r1, _r2, _r3);
            _mm256_store_ps(pp, _r0);
            _mm256_store_ps(pp + 8, _r1);
            _mm256_store_ps(pp + 16, _r2);
            _mm256_store_ps(pp + 24, _r3);
            pp += 32;
            p0 += 8;
            p1 += 8;
            p2 += 8;
            p3 += 8;
        }
#endif // __AVX__
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128 _r0 = _mm_loadu_ps(p0);
            __m128 _r1 = _mm_loadu_ps(p1);
            __m128 _r2 = _mm_loadu_ps(p2);
            __m128 _r3 = _mm_loadu_ps(p3);
            _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
            _mm_store_ps(pp, _r0);
            _mm_store_ps(pp + 4, _r1);
            _mm_store_ps(pp + 8, _r2);
            _mm_store_ps(pp + 12, _r3);
            pp += 16;
            p0 += 4;
            p1 += 4;
            p2 += 4;
            p3 += 4;
        }
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp[1] = p1[0];
            pp[2] = p2[0];
            pp[3] = p3[0];
            pp += 4;
            p0++;
            p1++;
            p2++;
            p3++;
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
        const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
        const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;

        int kk = 0;
#if __SSE2__
#if __AVX__
        for (; kk + 7 < max_kk; kk += 8)
        {
            __m256 _r0 = _mm256_loadu_ps(p0);
            __m256 _r1 = _mm256_loadu_ps(p1);
            transpose8x2_ps(_r0, _r1);
            _mm256_storeu_ps(pp, _r0);
            _mm256_storeu_ps(pp + 8, _r1);
            pp += 16;
            p0 += 8;
            p1 += 8;
        }
#endif // __AVX__
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128 _r0 = _mm_loadu_ps(p0);
            __m128 _r1 = _mm_loadu_ps(p1);
            __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
            __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
            _mm_store_ps(pp, _tmp0);
            _mm_store_ps(pp + 4, _tmp1);
            pp += 8;
            p0 += 4;
            p1 += 4;
        }
#endif // __SSE2__
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp[1] = p1[0];
            pp += 2;
            p0++;
            p1++;
        }
    }
    for (; ii < max_ii; ii += 1)
    {
        const float* p0 = (const float*)A + (i + ii) * A_hstep + k;

        int kk = 0;
#if __SSE2__
#if __AVX__
        for (; kk + 7 < max_kk; kk += 8)
        {
            _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
            pp += 8;
            p0 += 8;
        }
#endif // __AVX__
        for (; kk + 3 < max_kk; kk += 4)
        {
            _mm_storeu_ps(pp, _mm_loadu_ps(p0));
            pp += 4;
            p0 += 4;
        }
#endif // __SSE2__
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp += 1;
            p0++;
        }
    }
}